

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_get_tile(opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                     opj_event_mgr *p_manager,OPJ_UINT32 tile_index)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  opj_image_comp_t *poVar4;
  opj_image_comp_t *poVar5;
  void *__ptr;
  int iVar6;
  int iVar7;
  opj_bool oVar8;
  opj_image_t *p_image_dest;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  
  if (p_image == (opj_image_t *)0x0) {
    oVar8 = 0;
    opj_event_msg_v2(p_manager,1,"We need an image previously created.\n");
  }
  else {
    uVar11 = (p_j2k->m_cp).tw;
    uVar13 = tile_index / uVar11;
    uVar11 = tile_index % uVar11;
    uVar10 = (p_j2k->m_cp).tdx * uVar11 + (p_j2k->m_cp).tx0;
    p_image->x0 = uVar10;
    uVar14 = p_j2k->m_private_image->x0;
    if (uVar10 <= uVar14) {
      uVar10 = uVar14;
    }
    p_image->x0 = uVar10;
    uVar14 = (uVar11 + 1) * (p_j2k->m_cp).tdx + (p_j2k->m_cp).tx0;
    p_image->x1 = uVar14;
    uVar11 = p_j2k->m_private_image->x1;
    if (uVar11 <= uVar14) {
      uVar14 = uVar11;
    }
    p_image->x1 = uVar14;
    uVar15 = (p_j2k->m_cp).tdy * uVar13 + (p_j2k->m_cp).ty0;
    p_image->y0 = uVar15;
    uVar11 = p_j2k->m_private_image->y0;
    if (uVar15 <= uVar11) {
      uVar15 = uVar11;
    }
    p_image->y0 = uVar15;
    uVar13 = (uVar13 + 1) * (p_j2k->m_cp).tdy + (p_j2k->m_cp).ty0;
    p_image->y1 = uVar13;
    uVar11 = p_j2k->m_private_image->y1;
    if (uVar11 <= uVar13) {
      uVar13 = uVar11;
    }
    p_image->y1 = uVar13;
    uVar11 = p_image->numcomps;
    if ((ulong)uVar11 != 0) {
      poVar4 = p_image->comps;
      poVar5 = p_j2k->m_private_image->comps;
      lVar12 = 0;
      do {
        uVar1 = *(undefined4 *)((long)&poVar5->factor + lVar12);
        *(undefined4 *)((long)&poVar4->factor + lVar12) = uVar1;
        iVar2 = *(int *)((long)&poVar4->dx + lVar12);
        iVar3 = *(int *)((long)&poVar4->dy + lVar12);
        iVar6 = (int)((uVar10 - 1) + iVar2) / iVar2;
        *(int *)((long)&poVar4->x0 + lVar12) = iVar6;
        iVar7 = (int)((uVar15 - 1) + iVar3) / iVar3;
        *(int *)((long)&poVar4->y0 + lVar12) = iVar7;
        bVar9 = (byte)uVar1;
        iVar16 = 1 << (bVar9 & 0x1f);
        *(int *)((long)&poVar4->w + lVar12) =
             (iVar16 + (int)((uVar14 - 1) + iVar2) / iVar2 + -1 >> (bVar9 & 0x1f)) -
             (iVar16 + iVar6 + -1 >> (bVar9 & 0x1f));
        *(int *)((long)&poVar4->h + lVar12) =
             ((int)((uVar13 - 1) + iVar3) / iVar3 + iVar16 + -1 >> (bVar9 & 0x1f)) -
             (iVar16 + iVar7 + -1 >> (bVar9 & 0x1f));
        lVar12 = lVar12 + 0x38;
      } while ((ulong)uVar11 * 0x38 - lVar12 != 0);
    }
    if (p_j2k->m_output_image != (opj_image_t *)0x0) {
      opj_image_destroy(p_j2k->m_output_image);
    }
    p_image_dest = opj_image_create0();
    p_j2k->m_output_image = p_image_dest;
    oVar8 = 0;
    if (p_image_dest != (opj_image_t *)0x0) {
      opj_copy_image_header(p_image,p_image_dest);
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = tile_index;
      opj_procedure_list_add_procedure(p_j2k->m_procedure_list,j2k_decode_one_tile);
      oVar8 = j2k_exec(p_j2k,p_j2k->m_procedure_list,p_stream,p_manager);
      if (oVar8 == 0) {
        opj_image_destroy(p_j2k->m_private_image);
        p_j2k->m_private_image = (opj_image_t *)0x0;
        oVar8 = 0;
      }
      else {
        oVar8 = 1;
        if (p_image->numcomps != 0) {
          lVar12 = 0;
          uVar17 = 0;
          do {
            poVar4 = p_image->comps;
            *(undefined4 *)((long)&poVar4->resno_decoded + lVar12) =
                 *(undefined4 *)((long)&p_j2k->m_output_image->comps->resno_decoded + lVar12);
            __ptr = *(void **)((long)&poVar4->data + lVar12);
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
            poVar4 = p_j2k->m_output_image->comps;
            *(undefined8 *)((long)&p_image->comps->data + lVar12) =
                 *(undefined8 *)((long)&poVar4->data + lVar12);
            *(undefined8 *)((long)&poVar4->data + lVar12) = 0;
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x38;
          } while (uVar17 < p_image->numcomps);
        }
      }
    }
  }
  return oVar8;
}

Assistant:

opj_bool j2k_get_tile(	opj_j2k_v2_t *p_j2k,
						opj_stream_private_t *p_stream,
						opj_image_t* p_image,
						struct opj_event_mgr * p_manager,
						OPJ_UINT32 tile_index )
{
	OPJ_UINT32 compno;
	OPJ_UINT32 l_tile_x, l_tile_y;
	opj_image_comp_t* l_img_comp;

	if (!p_image) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "We need an image previously created.\n");
		return OPJ_FALSE;
	}

	if ( (tile_index < 0) && (tile_index >= p_j2k->m_cp.tw * p_j2k->m_cp.th) ){
		opj_event_msg_v2(p_manager, EVT_ERROR, "Tile index provided by the user is incorrect %d (max = %d) \n", tile_index, (p_j2k->m_cp.tw * p_j2k->m_cp.th) - 1);
		return OPJ_FALSE;
	}

	/* Compute the dimension of the desired tile*/
	l_tile_x = tile_index % p_j2k->m_cp.tw;
	l_tile_y = tile_index / p_j2k->m_cp.tw;

	p_image->x0 = l_tile_x * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
	if (p_image->x0 < p_j2k->m_private_image->x0)
		p_image->x0 = p_j2k->m_private_image->x0;
	p_image->x1 = (l_tile_x + 1) * p_j2k->m_cp.tdx + p_j2k->m_cp.tx0;
	if (p_image->x1 > p_j2k->m_private_image->x1)
		p_image->x1 = p_j2k->m_private_image->x1;

	p_image->y0 = l_tile_y * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
	if (p_image->y0 < p_j2k->m_private_image->y0)
		p_image->y0 = p_j2k->m_private_image->y0;
	p_image->y1 = (l_tile_y + 1) * p_j2k->m_cp.tdy + p_j2k->m_cp.ty0;
	if (p_image->y1 > p_j2k->m_private_image->y1)
		p_image->y1 = p_j2k->m_private_image->y1;

	l_img_comp = p_image->comps;
	for (compno=0; compno < p_image->numcomps; ++compno)
	{
		OPJ_INT32 l_comp_x1, l_comp_y1;

		l_img_comp->factor = p_j2k->m_private_image->comps[compno].factor;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_img_comp->w = int_ceildivpow2(l_comp_x1, l_img_comp->factor) - int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		l_img_comp->h = int_ceildivpow2(l_comp_y1, l_img_comp->factor) - int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);

		l_img_comp++;
	}

	/* Destroy the previous output image*/
	if (p_j2k->m_output_image)
		opj_image_destroy(p_j2k->m_output_image);

	/* Create the ouput image from the information previously computed*/
	p_j2k->m_output_image = opj_image_create0();
	if (! (p_j2k->m_output_image)) {
		return OPJ_FALSE;
	}
	opj_copy_image_header(p_image, p_j2k->m_output_image);

	p_j2k->m_specific_param.m_decoder.m_tile_ind_to_dec = tile_index;

	/* customization of the decoding */
	j2k_setup_decoding_tile(p_j2k);

	/* Decode the codestream */
	if (! j2k_exec (p_j2k,p_j2k->m_procedure_list,p_stream,p_manager)) {
		opj_image_destroy(p_j2k->m_private_image);
		p_j2k->m_private_image = NULL;
		return OPJ_FALSE;
	}

	/* Move data and copy one information from codec to output image*/
	for (compno = 0; compno < p_image->numcomps; compno++) {
		p_image->comps[compno].resno_decoded = p_j2k->m_output_image->comps[compno].resno_decoded;

		if (p_image->comps[compno].data)
			opj_free(p_image->comps[compno].data);

		p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;

		p_j2k->m_output_image->comps[compno].data = NULL;
	}

	return OPJ_TRUE;
}